

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcRootLogLikelihoods
          (BeagleCPUImpl<float,_1,_0> *this,int bufferIndex,int categoryWeightsIndex,
          int stateFrequenciesIndex,int scalingFactorsIndex,double *outSumLogLikelihood)

{
  int iVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  double *pdVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int k;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined8 in_XMM2_Qb;
  
  pfVar2 = this->gPartials[bufferIndex];
  pfVar3 = this->gCategoryWeights[categoryWeightsIndex];
  pfVar4 = this->gStateFrequencies[stateFrequenciesIndex];
  iVar14 = this->kPatternCount;
  if (iVar14 < 1) {
    iVar9 = 0;
  }
  else {
    iVar1 = this->kStateCount;
    pfVar5 = this->integrationTmp;
    iVar11 = 0;
    iVar9 = 0;
    iVar12 = 0;
    do {
      if (0 < iVar1) {
        iVar13 = 0;
        lVar15 = 0;
        do {
          *(float *)((long)pfVar5 + lVar15 + (long)iVar12 * 4) =
               *(float *)((long)pfVar2 + lVar15 + (long)iVar9 * 4) * *pfVar3;
          lVar15 = lVar15 + 4;
          iVar13 = iVar13 + -1;
        } while (-iVar1 != iVar13);
        iVar12 = iVar12 - iVar13;
        iVar9 = iVar9 - iVar13;
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar14);
  }
  iVar1 = this->kCategoryCount;
  if (1 < (long)iVar1) {
    iVar11 = this->kStateCount;
    lVar15 = 1;
    do {
      if (0 < iVar14) {
        pfVar5 = this->integrationTmp;
        iVar12 = 0;
        iVar13 = 0;
        do {
          if (0 < iVar11) {
            iVar8 = 0;
            lVar16 = 0;
            do {
              auVar18 = vfmadd213ss_fma(ZEXT416((uint)pfVar3[lVar15]),
                                        ZEXT416(*(uint *)((long)pfVar2 + lVar16 + (long)iVar9 * 4)),
                                        ZEXT416(*(uint *)((long)pfVar5 + lVar16 + (long)iVar13 * 4))
                                       );
              *(int *)((long)pfVar5 + lVar16 + (long)iVar13 * 4) = auVar18._0_4_;
              lVar16 = lVar16 + 4;
              iVar8 = iVar8 + -1;
            } while (-iVar11 != iVar8);
            iVar13 = iVar13 - iVar8;
            iVar9 = iVar9 - iVar8;
          }
          iVar12 = iVar12 + 1;
        } while (iVar12 != iVar14);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != iVar1);
  }
  uVar7 = (ulong)(uint)this->kPatternCount;
  if (0 < this->kPatternCount) {
    lVar15 = 0;
    iVar14 = 0;
    do {
      iVar9 = this->kStateCount;
      if ((long)iVar9 < 1) {
        dVar17 = 0.0;
      }
      else {
        auVar18 = ZEXT816(0);
        lVar16 = 0;
        do {
          auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)pfVar4[lVar16]),
                                    ZEXT416((uint)this->integrationTmp[iVar14 + lVar16]));
          lVar16 = lVar16 + 1;
        } while (iVar9 != lVar16);
        iVar14 = iVar14 + iVar9;
        dVar17 = (double)auVar18._0_4_;
      }
      dVar17 = log(dVar17);
      this->outLogLikelihoodsTmp[lVar15] = (float)dVar17;
      lVar15 = lVar15 + 1;
      uVar7 = (ulong)this->kPatternCount;
    } while (lVar15 < (long)uVar7);
  }
  if ((-1 < scalingFactorsIndex) && (0 < (int)uVar7)) {
    pfVar2 = this->gScaleBuffers[(uint)scalingFactorsIndex];
    pfVar3 = this->outLogLikelihoodsTmp;
    uVar10 = 0;
    do {
      pfVar3[uVar10] = pfVar2[uVar10] + pfVar3[uVar10];
      uVar10 = uVar10 + 1;
    } while ((uVar7 & 0xffffffff) != uVar10);
  }
  *outSumLogLikelihood = 0.0;
  if (0 < (int)uVar7) {
    pdVar6 = this->gPatternWeights;
    pfVar2 = this->outLogLikelihoodsTmp;
    auVar19 = ZEXT864((ulong)*outSumLogLikelihood);
    uVar10 = 0;
    do {
      auVar20._0_8_ = (double)pfVar2[uVar10];
      auVar20._8_8_ = in_XMM2_Qb;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = pdVar6[uVar10];
      auVar18 = vfmadd231sd_fma(auVar19._0_16_,auVar20,auVar18);
      auVar19 = ZEXT1664(auVar18);
      *outSumLogLikelihood = auVar18._0_8_;
      uVar10 = uVar10 + 1;
    } while ((uVar7 & 0xffffffff) != uVar10);
  }
  return (uint)(!NAN(*outSumLogLikelihood) && !NAN(*outSumLogLikelihood)) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoods(const int bufferIndex,
                            const int categoryWeightsIndex,
                            const int stateFrequenciesIndex,
                            const int scalingFactorsIndex,
                            double* outSumLogLikelihood) {

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* rootPartials = gPartials[bufferIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];
    int u = 0;
    int v = 0;
    for (int k = 0; k < kPatternCount; k++) {
        for (int i = 0; i < kStateCount; i++) {
            integrationTmp[u] = rootPartials[v] * (REALTYPE) wt[0];
            u++;
            v++;
        }
        v += P_PAD;
    }
    for (int l = 1; l < kCategoryCount; l++) {
        u = 0;
        for (int k = 0; k < kPatternCount; k++) {
            for (int i = 0; i < kStateCount; i++) {
                integrationTmp[u] += rootPartials[v] * (REALTYPE) wt[l];
                u++;
                v++;
            }
            v += P_PAD;
        }
    }
    u = 0;
    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE sum = 0.0;
        for (int i = 0; i < kStateCount; i++) {
            sum += freqs[i] * integrationTmp[u];
            u++;
        }

        outLogLikelihoodsTmp[k] = log(sum);
    }

    if (scalingFactorsIndex >= 0) {
        const REALTYPE* cumulativeScaleFactors = gScaleBuffers[scalingFactorsIndex];
        for(int i=0; i<kPatternCount; i++) {
            outLogLikelihoodsTmp[i] += cumulativeScaleFactors[i];
        }
    }

    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    // TODO: merge the three kPatternCount loops above into one

    return returnCode;
}